

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

iterator __thiscall
QHash<QtPrivate::QModelIndexWrapper,QSortFilterProxyModelPrivate::Mapping*>::
emplace<QSortFilterProxyModelPrivate::Mapping*const&>
          (QHash<QtPrivate::QModelIndexWrapper,QSortFilterProxyModelPrivate::Mapping*> *this,
          QModelIndexWrapper *key,Mapping **args)

{
  Data<QHashPrivate::Node<QtPrivate::QModelIndexWrapper,_QSortFilterProxyModelPrivate::Mapping_*>_>
  *pDVar1;
  Mapping *pMVar2;
  long in_FS_OFFSET;
  piter pVar3;
  QHash<QtPrivate::QModelIndexWrapper,_QSortFilterProxyModelPrivate::Mapping_*> local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pMVar2 = *(Mapping **)this;
  if (pMVar2 == (Mapping *)0x0) {
    local_28.d = (Data *)0x0;
LAB_00484f93:
    pMVar2 = (Mapping *)0x0;
LAB_00484fb4:
    pDVar1 = QHashPrivate::
             Data<QHashPrivate::Node<QtPrivate::QModelIndexWrapper,_QSortFilterProxyModelPrivate::Mapping_*>_>
             ::detached((Data<QHashPrivate::Node<QtPrivate::QModelIndexWrapper,_QSortFilterProxyModelPrivate::Mapping_*>_>
                         *)pMVar2);
    *(Data<QHashPrivate::Node<QtPrivate::QModelIndexWrapper,_QSortFilterProxyModelPrivate::Mapping_*>_>
      **)this = pDVar1;
LAB_00484fbc:
    pVar3 = (piter)emplace_helper<QSortFilterProxyModelPrivate::Mapping*const&>(this,key,args);
    QHash<QtPrivate::QModelIndexWrapper,_QSortFilterProxyModelPrivate::Mapping_*>::~QHash(&local_28)
    ;
  }
  else {
    if (1 < *(uint *)&(pMVar2->source_rows).d.d) {
      local_28.d = (Data *)pMVar2;
      if (*(int *)&(pMVar2->source_rows).d.d != -1) {
        LOCK();
        *(int *)&(pMVar2->source_rows).d.d = *(int *)&(pMVar2->source_rows).d.d + 1;
        UNLOCK();
        pMVar2 = *(Mapping **)this;
        if (pMVar2 == (Mapping *)0x0) goto LAB_00484f93;
      }
      if (1 < *(uint *)&(pMVar2->source_rows).d.d) goto LAB_00484fb4;
      goto LAB_00484fbc;
    }
    if ((pMVar2->source_rows).d.ptr < (int *)((ulong)(pMVar2->source_rows).d.size >> 1)) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        pVar3 = (piter)emplace_helper<QSortFilterProxyModelPrivate::Mapping*const&>(this,key,args);
        return (iterator)pVar3;
      }
      goto LAB_0048503b;
    }
    local_28.d = (Data *)*args;
    pVar3 = (piter)emplace_helper<QSortFilterProxyModelPrivate::Mapping*>
                             (this,key,(Mapping **)&local_28);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (iterator)pVar3;
  }
LAB_0048503b:
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }